

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapUniq.c
# Opt level: O0

int Amap_LibCreateNode(Amap_Lib_t *p,int iFan0,int iFan1,int fXor)

{
  uint uVar1;
  Amap_Nod_t *pAVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined4 uVar8;
  Amap_Nod_t *pAVar9;
  Vec_Int_t *pVVar10;
  int iFan;
  Amap_Nod_t *pNode;
  uint local_18;
  int fXor_local;
  int iFan1_local;
  int iFan0_local;
  Amap_Lib_t *p_local;
  
  local_18 = iFan1;
  fXor_local = iFan0;
  if (iFan0 < iFan1) {
    local_18 = iFan0;
    fXor_local = iFan1;
  }
  pAVar9 = Amap_LibCreateObj(p);
  iVar3 = 4;
  if (fXor != 0) {
    iVar3 = 5;
  }
  *(uint *)pAVar9 = *(uint *)pAVar9 & 0xffffff | iVar3 << 0x18;
  pAVar2 = p->pNodes;
  iVar3 = Abc_Lit2Var(fXor_local);
  uVar1 = *(uint *)(pAVar2 + iVar3);
  pAVar2 = p->pNodes;
  iVar3 = Abc_Lit2Var(local_18);
  *(uint *)pAVar9 =
       *(uint *)pAVar9 & 0xff00ffff |
       ((uVar1 >> 0x10 & 0xff) + (*(uint *)(pAVar2 + iVar3) >> 0x10 & 0xff) & 0xff) << 0x10;
  pAVar9->iFan0 = (short)fXor_local;
  pAVar9->iFan1 = (short)local_18;
  if (p->fVerbose != 0) {
    uVar1 = *(uint *)pAVar9;
    uVar4 = 0x20;
    if (fXor != 0) {
      uVar4 = 0x78;
    }
    uVar5 = Abc_Lit2Var(fXor_local);
    iVar3 = Abc_LitIsCompl(fXor_local);
    uVar6 = 0x2b;
    if (iVar3 != 0) {
      uVar6 = 0x2d;
    }
    uVar7 = Abc_Lit2Var(local_18);
    iVar3 = Abc_LitIsCompl(local_18);
    uVar8 = 0x2b;
    if (iVar3 != 0) {
      uVar8 = 0x2d;
    }
    printf("Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n",(ulong)(uVar1 & 0xffff),
           (ulong)uVar4,(ulong)uVar5,(ulong)uVar6,(ulong)uVar7,uVar8);
  }
  if (fXor == 0) {
    if (fXor_local == local_18) {
      pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRules,fXor_local);
      Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | local_18);
    }
    else {
      pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRules,fXor_local);
      Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | local_18);
      pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRules,local_18);
      Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | fXor_local);
    }
  }
  else if (fXor_local == local_18) {
    pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRulesX,fXor_local);
    Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | local_18);
  }
  else {
    pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRulesX,fXor_local);
    Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | local_18);
    pVVar10 = (Vec_Int_t *)Vec_PtrEntry(p->vRulesX,local_18);
    Vec_IntPushOrderWithMask(pVVar10,*(int *)pAVar9 << 0x10 | fXor_local);
  }
  return *(uint *)pAVar9 & 0xffff;
}

Assistant:

int Amap_LibCreateNode( Amap_Lib_t * p, int iFan0, int iFan1, int fXor )
{
    Amap_Nod_t * pNode;
    int iFan;
    if ( iFan0 < iFan1 )
    {
        iFan  = iFan0;
        iFan0 = iFan1;
        iFan1 = iFan;
    }
    pNode = Amap_LibCreateObj( p );
    pNode->Type  = fXor? AMAP_OBJ_XOR : AMAP_OBJ_AND;
    pNode->nSuppSize = p->pNodes[Abc_Lit2Var(iFan0)].nSuppSize + p->pNodes[Abc_Lit2Var(iFan1)].nSuppSize;
    pNode->iFan0 = iFan0;
    pNode->iFan1 = iFan1;
if ( p->fVerbose )
printf( "Creating node %5d %c :  iFan0 = %5d%c  iFan1 = %5d%c\n", 
pNode->Id, (fXor?'x':' '), 
Abc_Lit2Var(iFan0), (Abc_LitIsCompl(iFan0)?'-':'+'), 
Abc_Lit2Var(iFan1), (Abc_LitIsCompl(iFan1)?'-':'+') );

    if ( fXor )
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRulesX, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    else
    {
        if ( iFan0 == iFan1 )
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
        else
        {
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan0), (pNode->Id << 16) | iFan1 );
            Vec_IntPushOrderWithMask( (Vec_Int_t *)Vec_PtrEntry(p->vRules, iFan1), (pNode->Id << 16) | iFan0 );
        }
    }
    return pNode->Id;
}